

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_insert(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  TRef TVar2;
  MSize MVar3;
  GCfunc *J_00;
  undefined8 *in_RSI;
  jit_State *in_RDI;
  GCtab *t;
  TRef trlen;
  RecordIndex ix;
  RecordFFData *in_stack_fffffffffffffef8;
  jit_State *pjVar4;
  undefined6 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff06;
  jit_State *in_stack_ffffffffffffff08;
  GCtab *t_00;
  GCRef local_e0;
  undefined4 local_dc;
  GCtab local_d8;
  GCRef local_b0;
  MRef local_ac;
  TRef local_a8;
  undefined4 local_9c;
  undefined8 *local_98;
  jit_State *local_90;
  IRRef1 local_86;
  IRRef1 local_84;
  undefined2 local_82;
  int local_74;
  GCtab *local_70;
  GCfunc *local_68;
  IRIns local_60;
  lua_State *local_58;
  BCReg local_4c;
  IRIns J_01;
  
  local_b0.gcptr32 = *in_RDI->base;
  local_a8 = in_RDI->base[1];
  in_RSI[1] = 0;
  if (((local_b0.gcptr32 & 0x1f000000) == 0xb000000) && (local_a8 != 0)) {
    if (in_RDI->base[2] == 0) {
      local_98 = in_RSI;
      local_90 = in_RDI;
      TVar2 = lj_ir_call(in_RDI,IRCALL_lj_tab_len,(ulong)local_b0.gcptr32);
      J_00 = (GCfunc *)(ulong)*(uint *)*local_98;
      IVar1 = (IRRef1)TVar2;
      pjVar4 = local_90;
      TVar2 = lj_ir_kint((jit_State *)&J_00->c,(int32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      local_82 = 0x2913;
      local_86 = (IRRef1)TVar2;
      (pjVar4->fold).ins.field_0.ot = 0x2913;
      (pjVar4->fold).ins.field_0.op1 = IVar1;
      (pjVar4->fold).ins.field_0.op2 = local_86;
      local_84 = IVar1;
      local_ac.ptr32 = lj_opt_fold(in_stack_ffffffffffffff08);
      local_58 = local_90->L;
      local_60 = (IRIns)&local_e0;
      local_4c = 0xfffffff4;
      local_e0.gcptr32 = (uint32_t)J_00;
      local_dc._0_1_ = 0xf4;
      local_dc._1_1_ = 0xff;
      local_dc._2_2_ = 0xffff;
      t_00 = &local_d8;
      local_68 = J_00;
      J_01 = local_60;
      MVar3 = lj_tab_len(t_00);
      local_74 = MVar3 + 1;
      local_70 = t_00;
      *(double *)t_00 = (double)local_74;
      local_9c = 0;
      lj_record_idx((jit_State *)J_01,(RecordIndex *)&J_00->c);
    }
    else {
      recff_nyi((jit_State *)CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00),
                in_stack_fffffffffffffef8);
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_insert(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  ix.val = J->base[1];
  rd->nres = 0;
  if (tref_istab(ix.tab) && ix.val) {
    if (!J->base[2]) {  /* Simple push: t[#t+1] = v */
      TRef trlen = lj_ir_call(J, IRCALL_lj_tab_len, ix.tab);
      GCtab *t = tabV(&rd->argv[0]);
      ix.key = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
      settabV(J->L, &ix.tabv, t);
      setintV(&ix.keyv, lj_tab_len(t) + 1);
      ix.idxchain = 0;
      lj_record_idx(J, &ix);  /* Set new value. */
    } else {  /* Complex case: insert in the middle. */
      recff_nyiu(J, rd);
      return;
    }
  }  /* else: Interpreter will throw. */
}